

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O1

void lowmc_compute_aux(lowmc_parameters_t *lowmc,lowmc_key_t *key,randomTape_t *tapes)

{
  uint8_t *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  sbyte sVar5;
  word256 v;
  word256 v_00;
  word256 v_01;
  word256 v_02;
  word256 v_03;
  word256 v_04;
  undefined1 *puVar6;
  uint uVar7;
  uint uVar8;
  undefined8 *puVar9;
  word *pwVar10;
  byte *pbVar11;
  uint uVar12;
  long lVar13;
  byte bVar14;
  byte *pbVar15;
  word *pwVar16;
  mzd_local_t *pmVar17;
  byte bVar18;
  long lVar19;
  ulong *puVar20;
  ulong uVar21;
  size_t bits_1;
  size_t bits;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar40 [16];
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  lowmc_round_t *plVar27;
  uint uVar28;
  lowmc_round_t *plVar29;
  long lVar30;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  word128 aux [2];
  mzd_local_t y [1];
  mzd_local_t y_3 [1];
  undefined1 in_stack_fffffffffffffe40 [16];
  randomTape_t *prVar60;
  undefined4 uVar61;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 uVar62;
  anon_union_8_2_94730226_for_buffer local_1a0;
  ulong uStack_198;
  ulong auStack_190 [5];
  size_t local_168;
  lowmc_round_t *local_160;
  lowmc_key_t *local_158;
  undefined8 local_150;
  undefined1 auStack_148 [4];
  undefined1 local_144 [4];
  mzd_local_t local_140;
  mzd_local_t local_120;
  anon_union_8_2_94730226_for_buffer local_f0;
  ulong local_e8;
  anon_union_8_2_94730226_for_buffer local_e0;
  ulong local_d8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  
  uVar7 = (uint)lowmc->m | (uint)lowmc->n << 0x10;
  local_158 = key;
  if ((~DAT_001c310c & 0x20400) == 0) {
    if (uVar7 == 0xff0055) {
      local_140.w64[0] = 0;
      local_140.w64[1] = 0;
      local_140.w64[2] = 0;
      local_140.w64[3] = 0;
      mzd_copy_s256_256((mzd_local_t *)local_a0,key);
      mzd_mul_v_s256_256(key,(mzd_local_t *)local_a0,Ki_0);
      plVar29 = rounds + 3;
      local_144 = (undefined1  [4])0x5fa;
      uVar7 = 0xffffffcf;
      local_160 = (lowmc_round_t *)0x39;
      local_168 = CONCAT44(local_168._4_4_,0xffffffd0);
      local_150 = (undefined1 *)0x38;
      lVar30 = 0;
      do {
        local_c0._0_8_ = lVar30;
        mzd_addmul_v_s256_256(&local_140,local_158,plVar29->k_matrix);
        mzd_mul_v_s256_256(&local_120,&local_140,plVar29->li_matrix);
        if (local_c0._0_8_ == 3) {
          mzd_copy_s256_256(&local_140,(mzd_local_t *)local_a0);
          prVar60 = tapes;
        }
        else {
          local_80._0_8_ = plVar29;
          uVar28 = (uint)local_144 & 6;
          uVar8 = -uVar28 - 0x2f;
          uVar25 = (ulong)uVar28 + 0x37;
          puVar1 = tapes->parity_tapes;
          uVar23 = (ulong)(uint)((int)(3 - local_c0._0_8_) << 9) + (3 - local_c0._0_8_) * -2;
          uVar21 = 0xff;
          pwVar10 = local_140.w64 + 3;
          do {
            pwVar16 = pwVar10;
            bVar14 = 8 - ((byte)uVar23 & 6);
            pbVar11 = puVar1 + (uVar23 >> 3) + 1;
            sVar5 = (bVar14 < 0x21) * (' ' - bVar14);
            uVar24 = (ulong)(((uint)pbVar11[-1] << sVar5) >> sVar5);
            uVar22 = (ulong)uVar28 + 0x38;
            uVar12 = -uVar28 - 0x30;
            do {
              uVar24 = (ulong)*pbVar11 | uVar24 << 8;
              pbVar11 = pbVar11 + 1;
              uVar12 = uVar12 + 8;
              uVar22 = uVar22 - 8;
            } while (7 < (uint)uVar22);
            if ((uint)uVar22 != 0) {
              sVar5 = ((byte)uVar22 < 0x21) * (' ' - (byte)uVar22);
              uVar24 = (ulong)(((uint)(*pbVar11 >> (uVar12 & 0x1f)) << sVar5) >> sVar5) |
                       uVar24 << (uVar22 & 0x3f);
            }
            uVar23 = uVar23 + 0x40;
            *pwVar16 = uVar24;
            uVar21 = uVar21 - 0x40;
            pwVar10 = pwVar16 + -1;
          } while (0x3f < uVar21);
          pbVar11 = puVar1 + (uVar23 >> 3) + 1;
          uVar23 = (ulong)((uint)pbVar11[-1] & ~(-1 << (bVar14 & 0x1f)));
          do {
            uVar23 = (ulong)*pbVar11 | uVar23 << 8;
            pbVar11 = pbVar11 + 1;
            uVar8 = uVar8 + 8;
            uVar25 = uVar25 - 8;
          } while (7 < (uint)uVar25);
          if ((uint)uVar25 != 0) {
            sVar5 = ((byte)uVar25 < 0x21) * (' ' - (byte)uVar25);
            uVar23 = (ulong)(((uint)(*pbVar11 >> (uVar8 & 0x1f)) << sVar5) >> sVar5) |
                     uVar23 << (uVar25 & 0x3f);
          }
          local_140.w64[0] = uVar23 * 2;
          pwVar16 = pwVar16 + -2;
          lVar30 = (long)pwVar16 - (long)&local_140;
          prVar60 = tapes;
          if (&local_140 <= pwVar16) {
            memset((void *)((long)pwVar16 - lVar30),0,lVar30 + 8);
            prVar60 = tapes;
          }
        }
        puVar20 = auStack_190 + 1;
        iVar26 = (int)(3 - local_c0._0_8_);
        local_d8 = (ulong)(uint)(iVar26 << 9) + (3 - local_c0._0_8_) * -2 + 0xff;
        prVar60->pos = (uint32_t)local_d8;
        prVar60->aux_pos = iVar26 * 0xff;
        auVar41._8_8_ = local_140.w64[1];
        auVar41._0_8_ = local_140.w64[0];
        auVar41._16_8_ = local_140.w64[2];
        auVar41._24_8_ = local_140.w64[3];
        auVar43._8_8_ = local_120.w64[1];
        auVar43._0_8_ = local_120.w64[0];
        auVar43._16_8_ = local_120.w64[2];
        auVar43._24_8_ = local_120.w64[3];
        puVar1 = prVar60->parity_tapes;
        local_e0 = (anon_union_8_2_94730226_for_buffer)
                   ((anon_union_8_2_94730226_for_buffer *)(prVar60->tape + 0xf))->w;
        auStack_190[1] = 0;
        uVar8 = ~(-1 << ((byte)(8 - ((byte)local_d8 & 7)) & 0x1f));
        uVar23 = 0xff;
        uVar25 = local_d8;
        do {
          uVar21 = uVar25;
          pbVar11 = puVar1 + (uVar21 >> 3) + 1;
          uVar25 = (ulong)(pbVar11[-1] & uVar8);
          plVar27 = local_160;
          uVar28 = uVar7;
          do {
            uVar25 = (ulong)*pbVar11 | uVar25 << 8;
            pbVar11 = pbVar11 + 1;
            uVar28 = uVar28 + 8;
            plVar27 = (lowmc_round_t *)((long)plVar27 - 8);
          } while (7 < (uint)plVar27);
          if ((uint)plVar27 != 0) {
            sVar5 = ((byte)plVar27 < 0x21) * (' ' - (byte)plVar27);
            uVar25 = (ulong)(((uint)(*pbVar11 >> (uVar28 & 0x1f)) << sVar5) >> sVar5) |
                     uVar25 << ((ulong)plVar27 & 0x3f);
          }
          *puVar20 = uVar25;
          uVar23 = uVar23 - 0x40;
          puVar20 = puVar20 + -1;
          uVar25 = uVar21 + 0x40;
        } while (0x3f < uVar23);
        pbVar11 = puVar1 + (uVar21 + 0x40 >> 3) + 1;
        bVar14 = 8 - ((byte)uVar21 & 7);
        sVar5 = (bVar14 < 0x21) * (' ' - bVar14);
        uVar23 = (ulong)(((uint)pbVar11[-1] << sVar5) >> sVar5);
        uVar25 = (ulong)local_150;
        uVar28 = (uint)local_168;
        do {
          uVar23 = (ulong)*pbVar11 | uVar23 << 8;
          pbVar11 = pbVar11 + 1;
          uVar28 = uVar28 + 8;
          uVar25 = uVar25 - 8;
        } while (7 < (uint)uVar25);
        if ((uint)uVar25 != 0) {
          sVar5 = ((byte)uVar25 < 0x21) * (' ' - (byte)uVar25);
          uVar23 = (ulong)(((uint)(*pbVar11 >> (uVar28 & 0x1f)) << sVar5) >> sVar5) |
                   uVar23 << (uVar25 & 0x3f);
        }
        auVar45._24_8_ = auStack_190[1];
        auVar45._0_24_ = ZEXT824(uVar23 * 2);
        uStack_198 = 0;
        auStack_190[0] = 0;
        auStack_190[1] = 0;
        uVar23 = 0xff;
        puVar20 = auStack_190 + 1;
        uVar25 = local_d8;
        do {
          uVar21 = uVar25;
          pbVar11 = local_e0.w + (uVar21 >> 3) + 1;
          uVar25 = (ulong)(pbVar11[-1] & uVar8);
          plVar27 = local_160;
          uVar28 = uVar7;
          do {
            uVar25 = (ulong)*pbVar11 | uVar25 << 8;
            pbVar11 = pbVar11 + 1;
            uVar28 = uVar28 + 8;
            plVar27 = (lowmc_round_t *)((long)plVar27 - 8);
          } while (7 < (uint)plVar27);
          if ((uint)plVar27 != 0) {
            sVar5 = ((byte)plVar27 < 0x21) * (' ' - (byte)plVar27);
            uVar25 = (ulong)(((uint)(*pbVar11 >> (uVar28 & 0x1f)) << sVar5) >> sVar5) |
                     uVar25 << ((ulong)plVar27 & 0x3f);
          }
          *puVar20 = uVar25;
          uVar23 = uVar23 - 0x40;
          puVar20 = puVar20 + -1;
          uVar25 = uVar21 + 0x40;
        } while (0x3f < uVar23);
        pbVar11 = local_e0.w + (uVar21 + 0x40 >> 3) + 1;
        bVar14 = 8 - ((byte)uVar21 & 7);
        sVar5 = (bVar14 < 0x21) * (' ' - bVar14);
        uVar23 = (ulong)(((uint)pbVar11[-1] << sVar5) >> sVar5);
        uVar25 = (ulong)local_150;
        uVar8 = (uint)local_168;
        do {
          uVar23 = (ulong)*pbVar11 | uVar23 << 8;
          pbVar11 = pbVar11 + 1;
          uVar8 = uVar8 + 8;
          uVar25 = uVar25 - 8;
        } while (7 < (uint)uVar25);
        if ((uint)uVar25 != 0) {
          sVar5 = ((byte)uVar25 < 0x21) * (' ' - (byte)uVar25);
          uVar23 = (ulong)(((uint)(*pbVar11 >> (uVar8 & 0x1f)) << sVar5) >> sVar5) |
                   uVar23 << (uVar25 & 0x3f);
        }
        local_1a0.w = (uint8_t *)(uVar23 * 2);
        auVar44 = vpand_avx2(auVar43,_DAT_00136160);
        auVar42 = vpaddq_avx2(auVar44,auVar44);
        auVar44 = vpsrlq_avx2(auVar44,0x3f);
        auVar46 = vpermq_avx2(auVar44,0x93);
        auVar44 = vpand_avx2(auVar41,_DAT_00136140);
        auVar47 = vpsllq_avx2(auVar44,2);
        auVar44 = vpsrlq_avx2(auVar44,0x3e);
        auVar44 = vpermq_avx2(auVar44,0x93);
        auVar2 = vpor_avx2(auVar44,auVar47);
        auVar47 = vpand_avx2(auVar41,_DAT_00136160);
        auVar44 = vpaddq_avx2(auVar47,auVar47);
        auVar47 = vpsrlq_avx2(auVar47,0x3f);
        auVar47 = vpermq_avx2(auVar47,0x93);
        auVar47 = vpor_avx2(auVar47,auVar44);
        auVar42 = vpternlogq_avx512vl(auVar46,auVar2 ^ auVar47,auVar42,0x36);
        auVar44 = vpsrlq_avx2(auVar42,2);
        auVar42 = vpsllq_avx2(auVar42,0x3e);
        auVar42 = vpermq_avx2(auVar42,0x39);
        auVar46 = vpor_avx2(auVar42,auVar44);
        auVar42 = vpand_avx2(auVar43,_DAT_00136140);
        auVar44 = vpsllq_avx2(auVar42,2);
        auVar42 = vpsrlq_avx2(auVar42,0x3e);
        auVar42 = vpermq_avx2(auVar42,0x93);
        auVar42 = vpternlogq_avx512vl(auVar42,auVar2,auVar44,0x36);
        auVar49 = vpsrlq_avx2(auVar42,1);
        auVar42 = vpsllq_avx2(auVar42,0x3f);
        auVar3 = vpermq_avx2(auVar42,0x39);
        auVar42 = vpand_avx2(auVar41,_DAT_00136180);
        auVar44 = vpand_avx2(auVar42,auVar2);
        auVar55 = vpsrlq_avx2(auVar44,2);
        auVar44 = vpsllq_avx2(auVar44,0x3e);
        auVar4 = vpermq_avx2(auVar44,0x39);
        auVar44 = vpand_avx2(auVar2,auVar47);
        auVar42 = vpand_avx2(auVar42,auVar47);
        auVar48 = vpsrlq_avx2(auVar42,1);
        auVar42 = vpsllq_avx2(auVar42,0x3f);
        auVar42 = vpermq_avx2(auVar42,0x39);
        auVar41 = vpternlogq_avx512vl(auVar44,auVar41 ^ auVar43,_DAT_00136180,0x78);
        auVar41 = vpternlogq_avx512vl(auVar41,auVar42,auVar48,0x1e);
        auVar41 = vpternlogq_avx512vl(auVar41,auVar4,auVar55,0x1e);
        auVar41 = vpternlogq_avx512vl(auVar41,auVar3,auVar49,0x1e);
        auVar41 = vpternlogq_avx512vl(auVar45,auVar41,auVar46,0x96);
        auVar42._24_8_ = auStack_190[1];
        auVar42._0_24_ = ZEXT824((ulong)local_1a0);
        local_80 = vpternlogq_avx512vl(auVar41,auVar2 ^ auVar47,auVar42,0x96);
        v_01[2] = (longlong)prVar60;
        v_01[0] = in_stack_fffffffffffffe40._0_8_;
        v_01[1] = in_stack_fffffffffffffe40._8_8_;
        v_01[3]._0_4_ = uVar7;
        v_01[3]._4_4_ = in_stack_fffffffffffffe5c;
        w256_to_bitstream((bitstream_t *)&local_e0,v_01,4,0xff);
        local_1a0 = (anon_union_8_2_94730226_for_buffer)prVar60->aux_bits;
        uStack_198 = (ulong)prVar60->aux_pos;
        v_02[2] = (longlong)prVar60;
        v_02[0] = in_stack_fffffffffffffe40._0_8_;
        v_02[1] = in_stack_fffffffffffffe40._8_8_;
        v_02[3]._0_4_ = uVar7;
        v_02[3]._4_4_ = in_stack_fffffffffffffe5c;
        tapes = prVar60;
        w256_to_bitstream((bitstream_t *)&local_1a0,v_02,4,0xff);
        prVar60->aux_pos = prVar60->aux_pos + 0xff;
        lVar30 = local_c0._0_8_ + 1;
        plVar29 = plVar29 + -1;
        local_144 = (undefined1  [4])((int)local_144 - 0x1fe);
        uVar7 = uVar7 - 2;
        local_160 = (lowmc_round_t *)((long)local_160 + 2);
        local_168 = CONCAT44(local_168._4_4_,(uint)local_168 + -2);
        local_150 = (undefined1 *)((long)local_150 + 2);
      } while (lVar30 != 4);
    }
    else if (uVar7 == 0xc00040) {
      local_140.w64[0] = 0;
      local_140.w64[1] = 0;
      local_140.w64[2] = 0;
      local_140.w64[3] = 0;
      mzd_copy_s256_256((mzd_local_t *)local_a0,key);
      mzd_mul_v_s256_192(key,(mzd_local_t *)local_a0,Ki_0);
      plVar29 = rounds + 3;
      puVar9 = &local_150;
      if (local_144 + 3 < &local_150) {
        puVar9 = (undefined8 *)(local_144 + 3);
      }
      local_168 = ((ulong)(auStack_148 + (-1 - (long)puVar9)) & 0xfffffffffffffff8) + 8;
      local_150 = auStack_148 + -((ulong)(auStack_148 + (-1 - (long)puVar9)) & 0xfffffffffffffff8);
      uVar25 = 0x480;
      plVar27 = (lowmc_round_t *)0x540;
      lVar30 = 0;
      do {
        mzd_addmul_v_s256_192(&local_140,local_158,plVar29->k_matrix);
        mzd_mul_v_s256_192(&local_120,&local_140,plVar29->li_matrix);
        uVar61 = (undefined4)uVar25;
        uVar62 = (undefined4)(uVar25 >> 0x20);
        if (lVar30 == 3) {
          mzd_copy_s256_256(&local_140,(mzd_local_t *)local_a0);
          prVar60 = tapes;
        }
        else {
          puVar1 = tapes->parity_tapes;
          uVar23 = (ulong)(uint)((3 - (int)lVar30) * 0x80) * 3;
          pbVar11 = puVar1 + (uVar25 >> 3) + 1;
          lVar19 = 0xc0;
          pwVar10 = local_140.w64 + 2;
          do {
            uVar25 = (ulong)puVar1[uVar23 >> 3];
            iVar26 = -0x38;
            pbVar15 = pbVar11;
            do {
              uVar25 = (ulong)*pbVar15 | uVar25 << 8;
              pbVar15 = pbVar15 + 1;
              iVar26 = iVar26 + 8;
            } while (iVar26 != 0);
            uVar23 = uVar23 + 0x40;
            *pwVar10 = uVar25;
            pwVar10 = pwVar10 + -1;
            pbVar11 = pbVar11 + 8;
            lVar19 = lVar19 + -0x40;
          } while (lVar19 != 0);
          prVar60 = tapes;
          if (&local_140 <= pwVar10) {
            memset(local_150,0,local_168);
            prVar60 = tapes;
          }
        }
        iVar26 = 3 - (int)lVar30;
        local_d8 = (ulong)(uint)(iVar26 * 0x180) + 0xc0;
        prVar60->pos = (uint32_t)local_d8;
        prVar60->aux_pos = iVar26 * 0xc0;
        auVar3._8_8_ = local_140.w64[1];
        auVar3._0_8_ = local_140.w64[0];
        auVar3._16_8_ = local_140.w64[2];
        auVar3._24_8_ = local_140.w64[3];
        auVar4._8_8_ = local_120.w64[1];
        auVar4._0_8_ = local_120.w64[0];
        auVar4._16_8_ = local_120.w64[2];
        auVar4._24_8_ = local_120.w64[3];
        puVar1 = prVar60->parity_tapes;
        local_e0 = (anon_union_8_2_94730226_for_buffer)
                   ((anon_union_8_2_94730226_for_buffer *)(prVar60->tape + 0xf))->w;
        auStack_190[0] = 0;
        pbVar11 = puVar1 + ((ulong)plVar27 >> 3) + 1;
        lVar19 = 0xc0;
        puVar20 = auStack_190;
        uVar25 = local_d8;
        do {
          uVar23 = (ulong)puVar1[uVar25 >> 3];
          iVar26 = -0x38;
          pbVar15 = pbVar11;
          do {
            uVar23 = (ulong)*pbVar15 | uVar23 << 8;
            pbVar15 = pbVar15 + 1;
            iVar26 = iVar26 + 8;
          } while (iVar26 != 0);
          uVar25 = uVar25 + 0x40;
          *puVar20 = uVar23;
          puVar20 = puVar20 + -1;
          pbVar11 = pbVar11 + 8;
          lVar19 = lVar19 + -0x40;
        } while (lVar19 != 0);
        auVar48._16_8_ = auStack_190[0];
        auVar48._0_16_ = ZEXT816(0);
        auVar48._24_8_ = 0;
        local_1a0.w = (uint8_t *)0x0;
        uStack_198 = 0;
        auStack_190[0] = 0;
        auStack_190[1] = 0;
        pbVar11 = local_e0.w + ((ulong)plVar27 >> 3) + 1;
        lVar13 = 0xc0;
        puVar20 = auStack_190;
        lVar19 = CONCAT44(uVar62,uVar61);
        uVar25 = local_d8;
        do {
          uVar23 = (ulong)local_e0.w[uVar25 >> 3];
          iVar26 = -0x38;
          pbVar15 = pbVar11;
          do {
            uVar23 = (ulong)*pbVar15 | uVar23 << 8;
            pbVar15 = pbVar15 + 1;
            iVar26 = iVar26 + 8;
          } while (iVar26 != 0);
          uVar25 = uVar25 + 0x40;
          *puVar20 = uVar23;
          puVar20 = puVar20 + -1;
          pbVar11 = pbVar11 + 8;
          lVar13 = lVar13 + -0x40;
        } while (lVar13 != 0);
        auVar43 = vpand_avx2(auVar4,_DAT_001361c0);
        auVar41 = vpaddq_avx2(auVar43,auVar43);
        auVar43 = vpsrlq_avx2(auVar43,0x3f);
        auVar44 = vpermq_avx2(auVar43,0x93);
        auVar43 = vpand_avx2(auVar3,_DAT_001361a0);
        auVar45 = vpsllq_avx2(auVar43,2);
        auVar43 = vpsrlq_avx2(auVar43,0x3e);
        auVar43 = vpermq_avx2(auVar43,0x93);
        auVar42 = vpor_avx2(auVar43,auVar45);
        auVar45 = vpand_avx2(auVar3,_DAT_001361c0);
        auVar43 = vpaddq_avx2(auVar45,auVar45);
        auVar45 = vpsrlq_avx2(auVar45,0x3f);
        auVar45 = vpermq_avx2(auVar45,0x93);
        auVar45 = vpor_avx2(auVar45,auVar43);
        auVar41 = vpternlogq_avx512vl(auVar44,auVar42 ^ auVar45,auVar41,0x36);
        auVar43 = vpsrlq_avx2(auVar41,2);
        auVar41 = vpsllq_avx2(auVar41,0x3e);
        auVar41 = vpermq_avx2(auVar41,0x39);
        auVar44 = vpor_avx2(auVar41,auVar43);
        auVar41 = vpand_avx2(auVar4,_DAT_001361a0);
        auVar43 = vpsllq_avx2(auVar41,2);
        auVar41 = vpsrlq_avx2(auVar41,0x3e);
        auVar41 = vpermq_avx2(auVar41,0x93);
        auVar41 = vpternlogq_avx512vl(auVar41,auVar42,auVar43,0x36);
        auVar49 = vpsrlq_avx2(auVar41,1);
        auVar41 = vpsllq_avx2(auVar41,0x3f);
        auVar47 = vpermq_avx2(auVar41,0x39);
        auVar41 = vpand_avx2(auVar3,_DAT_001361e0);
        auVar43 = vpand_avx2(auVar41,auVar42);
        auVar55 = vpsrlq_avx2(auVar43,2);
        auVar43 = vpsllq_avx2(auVar43,0x3e);
        auVar2 = vpermq_avx2(auVar43,0x39);
        auVar43 = vpand_avx2(auVar42,auVar45);
        auVar41 = vpand_avx2(auVar41,auVar45);
        auVar46 = vpsrlq_avx2(auVar41,1);
        auVar41 = vpsllq_avx2(auVar41,0x3f);
        auVar41 = vpermq_avx2(auVar41,0x39);
        auVar43 = vpternlogq_avx512vl(auVar43,auVar3 ^ auVar4,_DAT_001361e0,0x78);
        auVar41 = vpternlogq_avx512vl(auVar43,auVar41,auVar46,0x1e);
        auVar41 = vpternlogq_avx512vl(auVar41,auVar2,auVar55,0x1e);
        auVar41 = vpternlogq_avx512vl(auVar41,auVar47,auVar49,0x1e);
        auVar41 = vpternlogq_avx512vl(auVar48,auVar41,auVar44,0x96);
        auVar49._16_8_ = auStack_190[0];
        auVar49._0_16_ = ZEXT816(0);
        auVar49._24_8_ = 0;
        local_c0 = vpternlogq_avx512vl(auVar41,auVar42 ^ auVar45,auVar49,0x96);
        v[2] = (longlong)prVar60;
        v[0] = in_stack_fffffffffffffe40._0_8_;
        v[1] = in_stack_fffffffffffffe40._8_8_;
        v[3]._0_4_ = uVar61;
        v[3]._4_4_ = uVar62;
        local_160 = plVar27;
        w256_to_bitstream((bitstream_t *)&local_e0,v,3,0xc0);
        local_1a0 = (anon_union_8_2_94730226_for_buffer)prVar60->aux_bits;
        uStack_198 = (ulong)prVar60->aux_pos;
        v_00[2] = (longlong)prVar60;
        v_00[0] = in_stack_fffffffffffffe40._0_8_;
        v_00[1] = in_stack_fffffffffffffe40._8_8_;
        v_00[3]._0_4_ = uVar61;
        v_00[3]._4_4_ = uVar62;
        tapes = prVar60;
        w256_to_bitstream((bitstream_t *)&local_1a0,v_00,3,0xc0);
        prVar60->aux_pos = prVar60->aux_pos + 0xc0;
        lVar30 = lVar30 + 1;
        plVar29 = plVar29 + -1;
        uVar25 = lVar19 - 0x180;
        plVar27 = plVar27 + -0xc;
      } while (lVar30 != 4);
    }
    else {
      local_140.w64[0] = 0;
      local_140.w64[1] = 0;
      local_140.w64[2] = 0;
      local_140.w64[3] = 0;
      mzd_copy_s256_256((mzd_local_t *)local_a0,key);
      mzd_mul_v_s256_129(key,(mzd_local_t *)local_a0,Ki_0);
      plVar29 = rounds + 3;
      local_168 = CONCAT44(local_168._4_4_,0x306);
      uVar7 = 0xffffffc9;
      uVar25 = 0x3f;
      local_160 = (lowmc_round_t *)0x0;
      do {
        mzd_addmul_v_s256_129(&local_140,local_158,plVar29->k_matrix);
        mzd_mul_v_s256_129(&local_120,&local_140,plVar29->li_matrix);
        if (local_160 == (lowmc_round_t *)0x3) {
          mzd_copy_s256_256(&local_140,(mzd_local_t *)local_a0);
          prVar60 = tapes;
        }
        else {
          local_c0._0_8_ = plVar29;
          puVar1 = tapes->parity_tapes;
          uVar8 = 3 - (int)local_160;
          uVar23 = (ulong)(uVar8 * 0x100) + (ulong)uVar8 * 2;
          uVar21 = 0x81;
          pwVar10 = local_140.w64 + 2;
          do {
            pwVar16 = pwVar10;
            bVar18 = (byte)uVar23 & 6;
            bVar14 = 8 - bVar18;
            pbVar11 = puVar1 + (uVar23 >> 3) + 1;
            sVar5 = (bVar14 < 0x21) * (' ' - bVar14);
            uVar24 = (ulong)(((uint)pbVar11[-1] << sVar5) >> sVar5);
            uVar22 = (ulong)((uint)local_168 & 6) | 0x38;
            uVar8 = -((uint)local_168 & 6) - 0x30;
            do {
              uVar24 = (ulong)*pbVar11 | uVar24 << 8;
              pbVar11 = pbVar11 + 1;
              uVar8 = uVar8 + 8;
              uVar22 = uVar22 - 8;
            } while (7 < (uint)uVar22);
            if ((uint)uVar22 != 0) {
              sVar5 = ((byte)uVar22 < 0x21) * (' ' - (byte)uVar22);
              uVar24 = (ulong)(((uint)(*pbVar11 >> (uVar8 & 0x1f)) << sVar5) >> sVar5) |
                       uVar24 << (uVar22 & 0x3f);
            }
            uVar23 = uVar23 + 0x40;
            *pwVar16 = uVar24;
            uVar21 = uVar21 - 0x40;
            pwVar10 = pwVar16 + -1;
          } while (0x3f < uVar21);
          local_140.w64[0] =
               (ulong)(((uint)puVar1[uVar23 >> 3] & ~(-1 << (bVar14 & 0x1f))) >> (bVar18 ^ 7)) <<
               0x3f;
          pmVar17 = (mzd_local_t *)(pwVar16 + -2);
          lVar30 = (long)pmVar17 - (long)&local_140;
          prVar60 = tapes;
          if (&local_140 <= pmVar17) {
            memset((void *)((long)pmVar17 - lVar30),0,lVar30 + 8);
            prVar60 = tapes;
          }
        }
        uVar8 = 3 - (int)local_160;
        local_d8 = (ulong)(uVar8 * 0x100) + 0x81 + (ulong)uVar8 * 2;
        prVar60->pos = (uint32_t)local_d8;
        prVar60->aux_pos = uVar8 * 0x80 | uVar8;
        auVar44._8_8_ = local_140.w64[1];
        auVar44._0_8_ = local_140.w64[0];
        auVar44._16_8_ = local_140.w64[2];
        auVar44._24_8_ = local_140.w64[3];
        auVar47._8_8_ = local_120.w64[1];
        auVar47._0_8_ = local_120.w64[0];
        auVar47._16_8_ = local_120.w64[2];
        auVar47._24_8_ = local_120.w64[3];
        puVar1 = prVar60->parity_tapes;
        local_e0 = (anon_union_8_2_94730226_for_buffer)
                   ((anon_union_8_2_94730226_for_buffer *)(prVar60->tape + 0xf))->w;
        auStack_190[0] = 0;
        uVar8 = ~(-1 << ((byte)(8 - ((byte)local_d8 & 7)) & 0x1f));
        uVar21 = 0x81;
        puVar20 = auStack_190;
        uVar23 = local_d8;
        do {
          uVar24 = uVar23;
          pbVar11 = puVar1 + (uVar24 >> 3) + 1;
          uVar22 = (ulong)(pbVar11[-1] & uVar8);
          uVar23 = uVar25;
          uVar28 = uVar7;
          do {
            uVar22 = (ulong)*pbVar11 | uVar22 << 8;
            pbVar11 = pbVar11 + 1;
            uVar28 = uVar28 + 8;
            uVar23 = uVar23 - 8;
          } while (7 < (uint)uVar23);
          if ((uint)uVar23 != 0) {
            sVar5 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
            uVar22 = (ulong)(((uint)(*pbVar11 >> (uVar28 & 0x1f)) << sVar5) >> sVar5) |
                     uVar22 << (uVar23 & 0x3f);
          }
          *puVar20 = uVar22;
          uVar21 = uVar21 - 0x40;
          puVar20 = puVar20 + -1;
          uVar23 = uVar24 + 0x40;
        } while (0x3f < uVar21);
        bVar14 = (byte)uVar24 & 7;
        bVar18 = 8 - bVar14;
        sVar5 = (bVar18 < 0x21) * (' ' - bVar18);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (ulong)((((uint)puVar1[uVar24 + 0x40 >> 3] << sVar5) >> sVar5) >>
                              (bVar14 ^ 7)) << 0x3f;
        auVar2._16_8_ = auStack_190[0];
        auVar2._24_8_ = 0;
        uStack_198 = 0;
        auStack_190[0] = 0;
        auStack_190[1] = 0;
        uVar21 = 0x81;
        puVar20 = auStack_190;
        uVar23 = local_d8;
        do {
          uVar24 = uVar23;
          pbVar11 = local_e0.w + (uVar24 >> 3) + 1;
          uVar22 = (ulong)(pbVar11[-1] & uVar8);
          uVar23 = uVar25;
          uVar28 = uVar7;
          do {
            uVar22 = (ulong)*pbVar11 | uVar22 << 8;
            pbVar11 = pbVar11 + 1;
            uVar28 = uVar28 + 8;
            uVar23 = uVar23 - 8;
          } while (7 < (uint)uVar23);
          if ((uint)uVar23 != 0) {
            sVar5 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
            uVar22 = (ulong)(((uint)(*pbVar11 >> (uVar28 & 0x1f)) << sVar5) >> sVar5) |
                     uVar22 << (uVar23 & 0x3f);
          }
          *puVar20 = uVar22;
          uVar21 = uVar21 - 0x40;
          puVar20 = puVar20 + -1;
          uVar23 = uVar24 + 0x40;
        } while (0x3f < uVar21);
        bVar18 = (byte)uVar24 & 7;
        bVar14 = 8 - bVar18;
        sVar5 = (bVar14 < 0x21) * (' ' - bVar14);
        local_1a0.w = (uint8_t *)
                      ((ulong)((((uint)local_e0.w[uVar24 + 0x40 >> 3] << sVar5) >> sVar5) >>
                              (bVar18 ^ 7)) << 0x3f);
        auVar43 = vpand_avx2(auVar47,_DAT_00136220);
        auVar41 = vpaddq_avx2(auVar43,auVar43);
        auVar43 = vpsrlq_avx2(auVar43,0x3f);
        auVar46 = vpermq_avx2(auVar43,0x93);
        auVar43 = vpand_avx2(auVar44,_DAT_00136200);
        auVar45 = vpsllq_avx2(auVar43,2);
        auVar43 = vpsrlq_avx2(auVar43,0x3e);
        auVar43 = vpermq_avx2(auVar43,0x93);
        auVar42 = vpor_avx2(auVar43,auVar45);
        auVar45 = vpand_avx2(auVar44,_DAT_00136220);
        auVar43 = vpaddq_avx2(auVar45,auVar45);
        auVar45 = vpsrlq_avx2(auVar45,0x3f);
        auVar45 = vpermq_avx2(auVar45,0x93);
        auVar45 = vpor_avx2(auVar45,auVar43);
        auVar41 = vpternlogq_avx512vl(auVar46,auVar42 ^ auVar45,auVar41,0x36);
        auVar43 = vpsrlq_avx2(auVar41,2);
        auVar41 = vpsllq_avx2(auVar41,0x3e);
        auVar41 = vpermq_avx2(auVar41,0x39);
        auVar46 = vpor_avx2(auVar41,auVar43);
        auVar41 = vpand_avx2(auVar47,_DAT_00136200);
        auVar43 = vpsllq_avx2(auVar41,2);
        auVar41 = vpsrlq_avx2(auVar41,0x3e);
        auVar41 = vpermq_avx2(auVar41,0x93);
        auVar41 = vpternlogq_avx512vl(auVar41,auVar42,auVar43,0x36);
        auVar49 = vpsrlq_avx2(auVar41,1);
        auVar41 = vpsllq_avx2(auVar41,0x3f);
        auVar3 = vpermq_avx2(auVar41,0x39);
        auVar41 = vpand_avx2(auVar44,_DAT_00136240);
        auVar43 = vpand_avx2(auVar41,auVar42);
        auVar55 = vpsrlq_avx2(auVar43,2);
        auVar43 = vpsllq_avx2(auVar43,0x3e);
        auVar4 = vpermq_avx2(auVar43,0x39);
        auVar43 = vpand_avx2(auVar42,auVar45);
        auVar41 = vpand_avx2(auVar41,auVar45);
        auVar48 = vpsrlq_avx2(auVar41,1);
        auVar41 = vpsllq_avx2(auVar41,0x3f);
        auVar41 = vpermq_avx2(auVar41,0x39);
        auVar43 = vpternlogq_avx512vl(auVar43,auVar44 ^ auVar47,_DAT_00136240,0x78);
        auVar41 = vpternlogq_avx512vl(auVar43,auVar41,auVar48,0x1e);
        auVar41 = vpternlogq_avx512vl(auVar41,auVar4,auVar55,0x1e);
        auVar41 = vpternlogq_avx512vl(auVar41,auVar3,auVar49,0x1e);
        auVar41 = vpternlogq_avx512vl(auVar2,auVar41,auVar46,0x96);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = local_1a0;
        auVar46._16_8_ = auStack_190[0];
        auVar46._24_8_ = 0;
        local_c0 = vpternlogq_avx512vl(auVar41,auVar42 ^ auVar45,auVar46,0x96);
        v_03[2] = (longlong)prVar60;
        v_03[0] = in_stack_fffffffffffffe40._0_8_;
        v_03[1] = in_stack_fffffffffffffe40._8_8_;
        v_03[3]._0_4_ = uVar7;
        v_03[3]._4_4_ = in_stack_fffffffffffffe5c;
        w256_to_bitstream((bitstream_t *)&local_e0,v_03,3,0x81);
        local_1a0 = (anon_union_8_2_94730226_for_buffer)prVar60->aux_bits;
        uStack_198 = (ulong)prVar60->aux_pos;
        v_04[2] = (longlong)prVar60;
        v_04[0] = in_stack_fffffffffffffe40._0_8_;
        v_04[1] = in_stack_fffffffffffffe40._8_8_;
        v_04[3]._0_4_ = uVar7;
        v_04[3]._4_4_ = in_stack_fffffffffffffe5c;
        tapes = prVar60;
        w256_to_bitstream((bitstream_t *)&local_1a0,v_04,3,0x81);
        prVar60->aux_pos = prVar60->aux_pos + 0x81;
        local_160 = (lowmc_round_t *)((long)local_160 + 1);
        plVar29 = plVar29 + -1;
        local_168 = CONCAT44(local_168._4_4_,(uint)local_168 + -0x102);
        uVar7 = uVar7 + 2;
        uVar25 = uVar25 - 2;
      } while (local_160 != (lowmc_round_t *)0x4);
    }
  }
  else if (uVar7 == 0xff0055) {
    local_120.w64[0] = 0;
    local_120.w64[1] = 0;
    local_120.w64[2] = 0;
    local_120.w64[3] = 0;
    mzd_copy_s128_256((mzd_local_t *)&local_e0,key);
    mzd_mul_v_s128_256(key,(mzd_local_t *)&local_e0,Ki_0);
    plVar29 = rounds + 3;
    local_144 = (undefined1  [4])0x5fa;
    uVar7 = 0xffffffcf;
    uVar25 = 0x39;
    local_168 = CONCAT44(local_168._4_4_,0xffffffd0);
    local_150 = (undefined1 *)0x38;
    lVar30 = 0;
    do {
      local_c0._0_8_ = lVar30;
      mzd_addmul_v_s128_256(&local_120,local_158,plVar29->k_matrix);
      local_80._0_8_ = plVar29;
      mzd_mul_v_s128_256((mzd_local_t *)local_a0,&local_120,plVar29->li_matrix);
      if (local_c0._0_8_ == 3) {
        mzd_copy_s128_256(&local_120,(mzd_local_t *)&local_e0);
        prVar60 = tapes;
      }
      else {
        uVar28 = (uint)local_144 & 6;
        uVar8 = -uVar28 - 0x2f;
        uVar23 = (ulong)uVar28 + 0x37;
        local_160 = (lowmc_round_t *)((ulong)uVar28 + 0x38);
        puVar1 = tapes->parity_tapes;
        uVar21 = (ulong)(uint)((int)(3 - local_c0._0_8_) << 9) + (3 - local_c0._0_8_) * -2;
        uVar22 = 0xff;
        pwVar10 = local_120.w64 + 3;
        do {
          pwVar16 = pwVar10;
          bVar14 = 8 - ((byte)uVar21 & 6);
          pbVar11 = puVar1 + (uVar21 >> 3) + 1;
          sVar5 = (bVar14 < 0x21) * (' ' - bVar14);
          uVar24 = (ulong)(((uint)pbVar11[-1] << sVar5) >> sVar5);
          plVar29 = local_160;
          uVar12 = -uVar28 - 0x30;
          do {
            uVar24 = (ulong)*pbVar11 | uVar24 << 8;
            pbVar11 = pbVar11 + 1;
            uVar12 = uVar12 + 8;
            plVar29 = (lowmc_round_t *)&plVar29[-1].constant;
          } while (7 < (uint)plVar29);
          if ((uint)plVar29 != 0) {
            sVar5 = ((byte)plVar29 < 0x21) * (' ' - (byte)plVar29);
            uVar24 = (ulong)(((uint)(*pbVar11 >> (uVar12 & 0x1f)) << sVar5) >> sVar5) |
                     uVar24 << ((ulong)plVar29 & 0x3f);
          }
          uVar21 = uVar21 + 0x40;
          *pwVar16 = uVar24;
          uVar22 = uVar22 - 0x40;
          pwVar10 = pwVar16 + -1;
        } while (0x3f < uVar22);
        pbVar11 = puVar1 + (uVar21 >> 3) + 1;
        uVar21 = (ulong)((uint)pbVar11[-1] & ~(-1 << (bVar14 & 0x1f)));
        do {
          uVar21 = (ulong)*pbVar11 | uVar21 << 8;
          pbVar11 = pbVar11 + 1;
          uVar8 = uVar8 + 8;
          uVar23 = uVar23 - 8;
        } while (7 < (uint)uVar23);
        if ((uint)uVar23 != 0) {
          sVar5 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
          uVar21 = (ulong)(((uint)(*pbVar11 >> (uVar8 & 0x1f)) << sVar5) >> sVar5) |
                   uVar21 << (uVar23 & 0x3f);
        }
        local_120.w64[0] = uVar21 * 2;
        pwVar16 = pwVar16 + -2;
        lVar30 = (long)pwVar16 - (long)&local_120;
        prVar60 = tapes;
        if (&local_120 <= pwVar16) {
          memset((void *)((long)pwVar16 - lVar30),0,lVar30 + 8);
          prVar60 = tapes;
        }
      }
      iVar26 = (int)(3 - local_c0._0_8_);
      local_e8 = (ulong)(uint)(iVar26 << 9) + (3 - local_c0._0_8_) * -2 + 0xff;
      prVar60->pos = (uint32_t)local_e8;
      prVar60->aux_pos = iVar26 * 0xff;
      auVar32._8_8_ = local_120.w64[1];
      auVar32._0_8_ = local_120.w64[0];
      auVar33._8_8_ = local_120.w64[3];
      auVar33._0_8_ = local_120.w64[2];
      auVar34 = vandpd_avx512vl(auVar32,_DAT_00136090);
      auVar52 = vandpd_avx(_DAT_001360a0,auVar33);
      auVar37 = vandpd_avx(_DAT_001360a0,auVar32);
      auVar51 = vandpd_avx(_DAT_001360b0,auVar33);
      auVar35 = vandpd_avx512vl(auVar32,_DAT_001360c0);
      auVar57 = vandpd_avx512vl(auVar33,_DAT_00136090);
      auVar58 = vpsrldq_avx(auVar34,8);
      auVar58 = vpsrlq_avx(auVar58,0x3e);
      auVar54 = vpsllq_avx(auVar34,2);
      auVar50 = vpslldq_avx(auVar52,8);
      auVar52 = vpshldq_avx512_vbmi2(auVar52,auVar50,2);
      auVar31 = vpor_avx(auVar58,auVar52);
      auVar50 = vpaddq_avx(auVar37,auVar37);
      auVar52 = vpslldq_avx(auVar33,8);
      auVar36 = vpshldq_avx512_vbmi2(auVar51,auVar52,1);
      auVar53 = vandpd_avx512vl(local_a0,_DAT_00136090);
      auVar52 = vandpd_avx(local_90,_DAT_001360a0);
      auVar51 = vandpd_avx(local_a0,_DAT_001360a0);
      auVar58 = vandpd_avx(local_90,_DAT_001360b0);
      auVar59 = vpsrldq_avx512vl(auVar53,8);
      auVar40 = vpsrlq_avx512vl(auVar59._0_16_,0x3e);
      auVar59 = vpslldq_avx512vl(auVar52,8);
      auVar56 = vpshldq_avx512_vbmi2(auVar52,auVar59._0_16_,2);
      auVar52 = vpaddq_avx(auVar51,auVar51);
      auVar59 = vpslldq_avx512vl(local_90,8);
      auVar51 = vpshldq_avx512_vbmi2(auVar58,auVar59._0_16_,1);
      auVar38 = vpxorq_avx512vl(auVar54,auVar50);
      auVar39 = vpxorq_avx512vl(auVar31,auVar36);
      auVar58 = vpxorq_avx512vl(auVar52,auVar38);
      auVar51 = vpxorq_avx512vl(auVar51,auVar39);
      auVar52._0_8_ = auVar53._0_8_ ^ auVar34._0_8_;
      auVar52._8_8_ = auVar53._8_8_ ^ auVar34._8_8_;
      auVar52 = vpaddq_avx(auVar52,auVar52);
      auVar34 = vpternlogq_avx512vl(auVar56,auVar31,auVar40,0x36);
      auVar32 = vpternlogq_avx512vl(local_a0,_DAT_001360c0,auVar32,0x48);
      auVar33 = vpternlogq_avx512vl(local_90,_DAT_00136090,auVar33,0x48);
      auVar53 = vpslldq_avx(auVar51,8);
      auVar58 = vpshldq_avx512_vbmi2(auVar53,auVar58,0x3e);
      auVar53 = vpsrldq_avx(auVar51,8);
      auVar51 = vpshldq_avx512_vbmi2(auVar53,auVar51,0x3e);
      auVar53 = vpslldq_avx(auVar34,8);
      auVar53 = vpsllq_avx(auVar53,0x3f);
      auVar52 = vpor_avx(auVar53,auVar52);
      auVar32 = vpternlogq_avx512vl(auVar52,auVar32,auVar58,0x96);
      auVar52 = vpsrldq_avx(auVar34,8);
      auVar52 = vpshldq_avx512_vbmi2(auVar52,auVar34,0x3f);
      auVar33 = vpternlogq_avx512vl(auVar52,auVar33,auVar51,0x96);
      auVar52 = vpand_avx(auVar54,auVar50);
      auVar51 = vpand_avx(auVar31,auVar36);
      auVar58 = vpand_avx(auVar36,auVar57);
      auVar50 = vpand_avx(auVar54,auVar35);
      auVar31 = vpand_avx(auVar31,auVar57);
      auVar34 = vpslldq_avx(auVar31,8);
      auVar50 = vpshldq_avx512_vbmi2(auVar34,auVar50,0x3e);
      auVar34 = vpsrldq_avx(auVar31,8);
      auVar31 = vpshldq_avx512_vbmi2(auVar34,auVar31,0x3e);
      auVar34 = vpsrlq_avx(auVar35,1);
      auVar37 = vpand_avx(auVar34,auVar37);
      auVar52 = vpternlogq_avx512vl(auVar37,auVar50,auVar52,0x96);
      auVar37 = vpsrldq_avx(auVar58,8);
      auVar37 = vpshldq_avx512_vbmi2(auVar37,auVar58,0x3f);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar31,auVar51,0x96);
      auVar52 = vpternlogq_avx512vl(auVar52,auVar32,auVar38,0x96);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar33,auVar39,0x96);
      puVar1 = prVar60->parity_tapes;
      local_f0 = (anon_union_8_2_94730226_for_buffer)
                 ((anon_union_8_2_94730226_for_buffer *)(prVar60->tape + 0xf))->w;
      auStack_190[1] = 0;
      uVar8 = ~(-1 << ((byte)(8 - ((byte)local_e8 & 7)) & 0x1f));
      uVar21 = 0xff;
      puVar20 = auStack_190 + 1;
      uVar23 = local_e8;
      do {
        uVar24 = uVar23;
        pbVar11 = puVar1 + (uVar24 >> 3) + 1;
        uVar22 = (ulong)(pbVar11[-1] & uVar8);
        uVar23 = uVar25;
        uVar28 = uVar7;
        do {
          uVar22 = (ulong)*pbVar11 | uVar22 << 8;
          pbVar11 = pbVar11 + 1;
          uVar28 = uVar28 + 8;
          uVar23 = uVar23 - 8;
        } while (7 < (uint)uVar23);
        if ((uint)uVar23 != 0) {
          sVar5 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
          uVar22 = (ulong)(((uint)(*pbVar11 >> (uVar28 & 0x1f)) << sVar5) >> sVar5) |
                   uVar22 << (uVar23 & 0x3f);
        }
        *puVar20 = uVar22;
        uVar21 = uVar21 - 0x40;
        puVar20 = puVar20 + -1;
        uVar23 = uVar24 + 0x40;
      } while (0x3f < uVar21);
      pbVar11 = puVar1 + (uVar24 + 0x40 >> 3) + 1;
      bVar14 = 8 - ((byte)uVar24 & 7);
      sVar5 = (bVar14 < 0x21) * (' ' - bVar14);
      uVar21 = (ulong)(((uint)pbVar11[-1] << sVar5) >> sVar5);
      uVar23 = (ulong)local_150;
      uVar28 = (uint)local_168;
      do {
        uVar21 = (ulong)*pbVar11 | uVar21 << 8;
        pbVar11 = pbVar11 + 1;
        uVar28 = uVar28 + 8;
        uVar23 = uVar23 - 8;
      } while (7 < (uint)uVar23);
      if ((uint)uVar23 != 0) {
        sVar5 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
        uVar21 = (ulong)(((uint)(*pbVar11 >> (uVar28 & 0x1f)) << sVar5) >> sVar5) |
                 uVar21 << (uVar23 & 0x3f);
      }
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar21 * 2;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = auStack_190[1];
      uStack_198 = 0;
      auStack_190[0] = 0;
      auStack_190[1] = 0;
      uVar21 = 0xff;
      puVar20 = auStack_190 + 1;
      uVar23 = local_e8;
      do {
        uVar24 = uVar23;
        pbVar11 = local_f0.w + (uVar24 >> 3) + 1;
        uVar22 = (ulong)(pbVar11[-1] & uVar8);
        uVar23 = uVar25;
        uVar28 = uVar7;
        do {
          uVar22 = (ulong)*pbVar11 | uVar22 << 8;
          pbVar11 = pbVar11 + 1;
          uVar28 = uVar28 + 8;
          uVar23 = uVar23 - 8;
        } while (7 < (uint)uVar23);
        if ((uint)uVar23 != 0) {
          sVar5 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
          uVar22 = (ulong)(((uint)(*pbVar11 >> (uVar28 & 0x1f)) << sVar5) >> sVar5) |
                   uVar22 << (uVar23 & 0x3f);
        }
        *puVar20 = uVar22;
        uVar21 = uVar21 - 0x40;
        puVar20 = puVar20 + -1;
        uVar23 = uVar24 + 0x40;
      } while (0x3f < uVar21);
      pbVar11 = local_f0.w + (uVar24 + 0x40 >> 3) + 1;
      bVar14 = 8 - ((byte)uVar24 & 7);
      sVar5 = (bVar14 < 0x21) * (' ' - bVar14);
      uVar21 = (ulong)(((uint)pbVar11[-1] << sVar5) >> sVar5);
      uVar23 = (ulong)local_150;
      uVar8 = (uint)local_168;
      do {
        uVar21 = (ulong)*pbVar11 | uVar21 << 8;
        pbVar11 = pbVar11 + 1;
        uVar8 = uVar8 + 8;
        uVar23 = uVar23 - 8;
      } while (7 < (uint)uVar23);
      if ((uint)uVar23 != 0) {
        sVar5 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
        uVar21 = (ulong)(((uint)(*pbVar11 >> (uVar8 & 0x1f)) << sVar5) >> sVar5) |
                 uVar21 << (uVar23 & 0x3f);
      }
      local_1a0.w = (uint8_t *)(uVar21 * 2);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_1a0;
      auVar50 = auVar52 ^ auVar51 ^ auVar50;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = auStack_190[1];
      auVar52 = auVar37 ^ auVar58 << 0x40 ^ auVar31 << 0x40;
      local_140.w64[0] = auVar50._0_8_;
      local_140.w64[1] = auVar50._8_8_;
      local_140.w64[2] = auVar52._0_8_;
      local_140.w64[3] = auVar52._8_8_;
      w128_to_bitstream((bitstream_t *)&local_f0,(word128 *)&local_140,4,0xff);
      local_1a0 = (anon_union_8_2_94730226_for_buffer)prVar60->aux_bits;
      uStack_198 = (ulong)prVar60->aux_pos;
      tapes = prVar60;
      w128_to_bitstream((bitstream_t *)&local_1a0,(word128 *)&local_140,4,0xff);
      prVar60->aux_pos = prVar60->aux_pos + 0xff;
      lVar30 = local_c0._0_8_ + 1;
      plVar29 = (lowmc_round_t *)(local_80._0_8_ + -0x20);
      local_144 = (undefined1  [4])((int)local_144 - 0x1fe);
      uVar7 = uVar7 - 2;
      uVar25 = uVar25 + 2;
      local_168 = CONCAT44(local_168._4_4_,(uint)local_168 + -2);
      local_150 = (undefined1 *)((long)local_150 + 2);
    } while (lVar30 != 4);
  }
  else if (uVar7 == 0xc00040) {
    local_120.w64[0] = 0;
    local_120.w64[1] = 0;
    local_120.w64[2] = 0;
    local_120.w64[3] = 0;
    mzd_copy_s128_256((mzd_local_t *)&local_e0,key);
    mzd_mul_v_s128_192(key,(mzd_local_t *)&local_e0,Ki_0);
    plVar29 = rounds + 3;
    puVar6 = (undefined1 *)((long)local_140.w64 + 0x1f);
    pwVar10 = local_140.w64 + 2;
    if (puVar6 < local_140.w64 + 2) {
      pwVar10 = (word *)puVar6;
    }
    uVar25 = (long)&local_140 + (0x17 - (long)pwVar10) & 0xfffffffffffffff8;
    local_168 = uVar25 + 8;
    local_150 = (undefined1 *)((long)&local_140 + (0x18 - uVar25));
    uVar25 = 0x480;
    plVar27 = (lowmc_round_t *)0x540;
    lVar30 = 0;
    do {
      mzd_addmul_v_s128_192(&local_120,local_158,plVar29->k_matrix);
      mzd_mul_v_s128_192((mzd_local_t *)local_a0,&local_120,plVar29->li_matrix);
      uVar61 = (undefined4)uVar25;
      uVar62 = (undefined4)(uVar25 >> 0x20);
      if (lVar30 == 3) {
        mzd_copy_s128_256(&local_120,(mzd_local_t *)&local_e0);
        prVar60 = tapes;
      }
      else {
        puVar1 = tapes->parity_tapes;
        uVar23 = (ulong)(uint)((3 - (int)lVar30) * 0x80) * 3;
        pbVar11 = puVar1 + (uVar25 >> 3) + 1;
        lVar19 = 0xc0;
        pwVar10 = local_120.w64 + 2;
        do {
          uVar25 = (ulong)puVar1[uVar23 >> 3];
          iVar26 = -0x38;
          pbVar15 = pbVar11;
          do {
            uVar25 = (ulong)*pbVar15 | uVar25 << 8;
            pbVar15 = pbVar15 + 1;
            iVar26 = iVar26 + 8;
          } while (iVar26 != 0);
          uVar23 = uVar23 + 0x40;
          *pwVar10 = uVar25;
          pwVar10 = pwVar10 + -1;
          pbVar11 = pbVar11 + 8;
          lVar19 = lVar19 + -0x40;
        } while (lVar19 != 0);
        prVar60 = tapes;
        if (&local_120 <= pwVar10) {
          memset(local_150,0,local_168);
          prVar60 = tapes;
        }
      }
      iVar26 = 3 - (int)lVar30;
      local_e8 = (ulong)(uint)(iVar26 * 0x180) + 0xc0;
      prVar60->pos = (uint32_t)local_e8;
      prVar60->aux_pos = iVar26 * 0xc0;
      auVar40._8_8_ = local_120.w64[1];
      auVar40._0_8_ = local_120.w64[0];
      auVar56._8_8_ = local_120.w64[3];
      auVar56._0_8_ = local_120.w64[2];
      auVar52 = vandpd_avx(_DAT_001360b0,auVar40);
      auVar51 = vpand_avx(ZEXT816(0x2492492492492492),auVar56);
      auVar37 = vandpd_avx(_DAT_00136090,auVar40);
      auVar58 = vpand_avx(ZEXT816(0x4924924924924924),auVar56);
      auVar31 = vandpd_avx512vl(auVar40,_DAT_001360a0);
      auVar32 = vpandq_avx512vl(auVar56,ZEXT816(0x9249249249249249));
      auVar50 = vpsrldq_avx(auVar52,8);
      auVar33 = vpshldq_avx512_vbmi2(auVar51,auVar50,2);
      auVar51 = vpslldq_avx(auVar52,8);
      auVar34 = vpshldq_avx512_vbmi2(auVar52,auVar51,2);
      auVar52 = vpsrldq_avx(auVar40,8);
      auVar35 = vpshldq_avx512_vbmi2(auVar58,auVar52,1);
      auVar51 = vpaddq_avx(auVar37,auVar37);
      auVar52 = vandpd_avx(local_a0,_DAT_001360b0);
      auVar58 = vpand_avx(local_90,ZEXT816(0x2492492492492492));
      auVar37 = vandpd_avx(local_a0,_DAT_00136090);
      auVar50 = vpand_avx(local_90,ZEXT816(0x4924924924924924));
      auVar57 = vpsrldq_avx(auVar52,8);
      auVar57 = vpshldq_avx512_vbmi2(auVar58,auVar57,2);
      auVar58 = vpslldq_avx(local_a0,8);
      auVar36 = vpshldq_avx512_vbmi2(auVar52,auVar58,2);
      auVar52 = vpsrldq_avx(local_a0,8);
      auVar58 = vpshldq_avx512_vbmi2(auVar50,auVar52,1);
      auVar52 = vpaddq_avx(auVar37,auVar37);
      auVar52 = auVar52 ^ auVar34 ^ auVar51;
      auVar58 = auVar58 ^ auVar33 ^ auVar35;
      auVar38._0_8_ = local_a0._0_8_ ^ local_120.w64[0];
      auVar38._8_8_ = local_a0._8_8_ ^ local_120.w64[1];
      auVar37 = vpternlogq_avx512vl(local_90,ZEXT816(0x9249249249249249),auVar56,0x48);
      auVar50 = vpslldq_avx(auVar58,8);
      auVar50 = vpsllq_avx(auVar50,0x3e);
      auVar53 = vpsrldq_avx(auVar52,8);
      auVar52 = vpshldq_avx512_vbmi2(auVar53,auVar52,0x3e);
      auVar53 = vpsrlq_avx(auVar58,2);
      auVar58 = vpslldq_avx(auVar57 ^ auVar33,8);
      auVar58 = vpshldq_avx512_vbmi2(auVar58,auVar36 ^ auVar34,0x3f);
      auVar57 = vpsrlq_avx(auVar57 ^ auVar33,1);
      auVar57 = vpternlogq_avx512vl(auVar57,auVar37,auVar53,0xfe);
      auVar37 = vpternlogq_avx512vl(auVar58,auVar38,_DAT_001360a0,0x78);
      auVar36 = vpternlogq_avx512vl(auVar37,auVar50,auVar52,0x1e);
      auVar52 = vpand_avx(auVar33,auVar35);
      auVar37 = vpand_avx(auVar51,auVar31);
      auVar58 = vpand_avx(auVar35,auVar32);
      auVar50 = vpand_avx(auVar34,auVar31);
      auVar31 = vpand_avx(auVar33,auVar32);
      auVar32 = vpslldq_avx(auVar31,8);
      auVar53 = vpsllq_avx(auVar32,0x3e);
      auVar32 = vpsrldq_avx(auVar50,8);
      auVar50 = vpshldq_avx512_vbmi2(auVar32,auVar50,0x3e);
      auVar32 = vpsrlq_avx(auVar31,2);
      auVar31 = vpslldq_avx(auVar58,8);
      auVar37 = vpshldq_avx512_vbmi2(auVar31,auVar37,0x3f);
      auVar58 = vpsrlq_avx(auVar58,1);
      auVar52 = vpternlogq_avx512vl(auVar58,auVar32,auVar52,0xfe);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar34,auVar51,0x78);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar53,auVar50,0x1e);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar36,auVar34 ^ auVar51,0x96);
      auVar52 = vpternlogq_avx512vl(auVar52,auVar57,auVar33 ^ auVar35,0x96);
      puVar1 = prVar60->parity_tapes;
      local_f0 = (anon_union_8_2_94730226_for_buffer)
                 ((anon_union_8_2_94730226_for_buffer *)(prVar60->tape + 0xf))->w;
      auStack_190[0] = 0;
      pbVar11 = puVar1 + ((ulong)plVar27 >> 3) + 1;
      lVar19 = 0xc0;
      puVar20 = auStack_190;
      uVar25 = local_e8;
      do {
        uVar23 = (ulong)puVar1[uVar25 >> 3];
        iVar26 = -0x38;
        pbVar15 = pbVar11;
        do {
          uVar23 = (ulong)*pbVar15 | uVar23 << 8;
          pbVar15 = pbVar15 + 1;
          iVar26 = iVar26 + 8;
        } while (iVar26 != 0);
        uVar25 = uVar25 + 0x40;
        *puVar20 = uVar23;
        puVar20 = puVar20 + -1;
        pbVar11 = pbVar11 + 8;
        lVar19 = lVar19 + -0x40;
      } while (lVar19 != 0);
      local_c0._0_8_ = plVar29;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = auStack_190[0];
      local_1a0.w = (uint8_t *)0x0;
      uStack_198 = 0;
      auStack_190[0] = 0;
      auStack_190[1] = 0;
      pbVar11 = local_f0.w + ((ulong)plVar27 >> 3) + 1;
      lVar19 = 0xc0;
      puVar20 = auStack_190;
      uVar25 = local_e8;
      do {
        uVar23 = (ulong)local_f0.w[uVar25 >> 3];
        iVar26 = -0x38;
        pbVar15 = pbVar11;
        do {
          uVar23 = (ulong)*pbVar15 | uVar23 << 8;
          pbVar15 = pbVar15 + 1;
          iVar26 = iVar26 + 8;
        } while (iVar26 != 0);
        uVar25 = uVar25 + 0x40;
        *puVar20 = uVar23;
        puVar20 = puVar20 + -1;
        pbVar11 = pbVar11 + 8;
        lVar19 = lVar19 + -0x40;
      } while (lVar19 != 0);
      auVar37 = auVar37 ^ ZEXT816(0) ^ ZEXT816(0);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = auStack_190[0];
      auVar54 = auVar52 ^ auVar39 ^ auVar54;
      local_140.w64[0] = auVar37._0_8_;
      local_140.w64[1] = auVar37._8_8_;
      local_140.w64[2] = auVar54._0_8_;
      local_140.w64[3] = auVar54._8_8_;
      local_160 = plVar27;
      w128_to_bitstream((bitstream_t *)&local_f0,(word128 *)&local_140,3,0xc0);
      local_1a0 = (anon_union_8_2_94730226_for_buffer)prVar60->aux_bits;
      uStack_198 = (ulong)prVar60->aux_pos;
      tapes = prVar60;
      w128_to_bitstream((bitstream_t *)&local_1a0,(word128 *)&local_140,3,0xc0);
      prVar60->aux_pos = prVar60->aux_pos + 0xc0;
      lVar30 = lVar30 + 1;
      plVar29 = (lowmc_round_t *)(local_c0._0_8_ + -0x20);
      uVar25 = CONCAT44(uVar62,uVar61) - 0x180;
      plVar27 = plVar27 + -0xc;
    } while (lVar30 != 4);
  }
  else {
    local_120.w64[0] = 0;
    local_120.w64[1] = 0;
    local_120.w64[2] = 0;
    local_120.w64[3] = 0;
    mzd_copy_s128_256((mzd_local_t *)&local_e0,key);
    mzd_mul_v_s128_129(key,(mzd_local_t *)&local_e0,Ki_0);
    plVar29 = rounds + 3;
    local_c0._0_4_ = 0x306;
    uVar7 = 0xffffffc9;
    uVar25 = 0x3f;
    lVar30 = 0;
    do {
      iVar26 = (int)lVar30;
      uVar61 = (undefined4)((ulong)lVar30 >> 0x20);
      mzd_addmul_v_s128_129(&local_120,local_158,plVar29->k_matrix);
      local_160 = plVar29;
      mzd_mul_v_s128_129((mzd_local_t *)local_a0,&local_120,plVar29->li_matrix);
      if (CONCAT44(uVar61,iVar26) == 3) {
        mzd_copy_s128_256(&local_120,(mzd_local_t *)&local_e0);
        prVar60 = tapes;
      }
      else {
        puVar1 = tapes->parity_tapes;
        uVar23 = (ulong)((3U - iVar26) * 0x100) + (ulong)(3U - iVar26) * 2;
        uVar21 = 0x81;
        pwVar10 = local_120.w64 + 2;
        do {
          pwVar16 = pwVar10;
          bVar18 = (byte)uVar23 & 6;
          bVar14 = 8 - bVar18;
          pbVar11 = puVar1 + (uVar23 >> 3) + 1;
          sVar5 = (bVar14 < 0x21) * (' ' - bVar14);
          uVar24 = (ulong)(((uint)pbVar11[-1] << sVar5) >> sVar5);
          uVar22 = (ulong)(local_c0._0_4_ & 6) | 0x38;
          uVar8 = -(local_c0._0_4_ & 6) - 0x30;
          do {
            uVar24 = (ulong)*pbVar11 | uVar24 << 8;
            pbVar11 = pbVar11 + 1;
            uVar8 = uVar8 + 8;
            uVar22 = uVar22 - 8;
          } while (7 < (uint)uVar22);
          if ((uint)uVar22 != 0) {
            sVar5 = ((byte)uVar22 < 0x21) * (' ' - (byte)uVar22);
            uVar24 = (ulong)(((uint)(*pbVar11 >> (uVar8 & 0x1f)) << sVar5) >> sVar5) |
                     uVar24 << (uVar22 & 0x3f);
          }
          uVar23 = uVar23 + 0x40;
          *pwVar16 = uVar24;
          uVar21 = uVar21 - 0x40;
          pwVar10 = pwVar16 + -1;
        } while (0x3f < uVar21);
        local_120.w64[0] =
             (ulong)(((uint)puVar1[uVar23 >> 3] & ~(-1 << (bVar14 & 0x1f))) >> (bVar18 ^ 7)) << 0x3f
        ;
        pmVar17 = (mzd_local_t *)(pwVar16 + -2);
        lVar30 = (long)pmVar17 - (long)&local_120;
        prVar60 = tapes;
        local_168 = uVar25;
        if (&local_120 <= pmVar17) {
          memset((void *)((long)pmVar17 - lVar30),0,lVar30 + 8);
          prVar60 = tapes;
        }
      }
      uVar8 = 3 - iVar26;
      local_e8 = (ulong)(uVar8 * 0x100) + 0x81 + (ulong)uVar8 * 2;
      prVar60->pos = (uint32_t)local_e8;
      prVar60->aux_pos = uVar8 * 0x80 | uVar8;
      auVar34._8_8_ = local_120.w64[1];
      auVar34._0_8_ = local_120.w64[0];
      auVar35._8_8_ = local_120.w64[3];
      auVar35._0_8_ = local_120.w64[2];
      auVar52 = vandpd_avx(_DAT_00136100,auVar34);
      auVar51 = vpand_avx(ZEXT816(0x2492492492492492),auVar35);
      auVar37 = vandpd_avx(_DAT_00136110,auVar34);
      auVar58 = vpand_avx(ZEXT816(0x4924924924924924),auVar35);
      auVar31 = vandpd_avx512vl(auVar34,_DAT_00136120);
      auVar32 = vpandq_avx512vl(auVar35,ZEXT816(0x9249249249249249));
      auVar50 = vpsrldq_avx(auVar52,8);
      auVar33 = vpshldq_avx512_vbmi2(auVar51,auVar50,2);
      auVar51 = vpslldq_avx(auVar52,8);
      auVar57 = vpshldq_avx512_vbmi2(auVar52,auVar51,2);
      auVar52 = vpsrldq_avx(auVar34,8);
      auVar36 = vpshldq_avx512_vbmi2(auVar58,auVar52,1);
      auVar51 = vpaddq_avx(auVar37,auVar37);
      auVar52 = vandpd_avx(local_a0,_DAT_00136100);
      auVar58 = vpand_avx(local_90,ZEXT816(0x2492492492492492));
      auVar37 = vandpd_avx(local_a0,_DAT_00136110);
      auVar50 = vpand_avx(local_90,ZEXT816(0x4924924924924924));
      auVar53 = vpsrldq_avx(auVar52,8);
      auVar53 = vpshldq_avx512_vbmi2(auVar58,auVar53,2);
      auVar58 = vpslldq_avx(auVar52,8);
      auVar40 = vpshldq_avx512_vbmi2(auVar52,auVar58,2);
      auVar52 = vpsrldq_avx(local_a0,8);
      auVar58 = vpshldq_avx512_vbmi2(auVar50,auVar52,1);
      auVar52 = vpaddq_avx(auVar37,auVar37);
      auVar52 = auVar52 ^ auVar57 ^ auVar51;
      auVar58 = auVar58 ^ auVar33 ^ auVar36;
      auVar37 = vpternlogq_avx512vl(local_a0,_DAT_00136120,auVar34,0x48);
      auVar50 = vpternlogq_avx512vl(local_90,ZEXT816(0x9249249249249249),auVar35,0x48);
      auVar34 = vpslldq_avx(auVar58,8);
      auVar34 = vpsllq_avx(auVar34,0x3e);
      auVar35 = vpsrldq_avx(auVar52,8);
      auVar52 = vpshldq_avx512_vbmi2(auVar35,auVar52,0x3e);
      auVar35 = vpsrlq_avx(auVar58,2);
      auVar58 = vpslldq_avx(auVar53 ^ auVar33,8);
      auVar56 = vpsllq_avx(auVar58,0x3f);
      auVar58 = vpsrlq_avx(auVar40 ^ auVar57,1);
      auVar37 = vpternlogq_avx512vl(auVar58,auVar56,auVar37,0xfe);
      auVar34 = vpternlogq_avx512vl(auVar37,auVar34,auVar52,0x1e);
      auVar52 = vpsrlq_avx(auVar53 ^ auVar33,1);
      auVar35 = vpternlogq_avx512vl(auVar52,auVar50,auVar35,0xfe);
      auVar52 = vpand_avx(auVar33,auVar36);
      auVar37 = vpand_avx(auVar51,auVar31);
      auVar58 = vpand_avx(auVar36,auVar32);
      auVar50 = vpand_avx(auVar57,auVar31);
      auVar31 = vpand_avx(auVar33,auVar32);
      auVar32 = vpslldq_avx(auVar31,8);
      auVar53 = vpsllq_avx(auVar32,0x3e);
      auVar32 = vpsrldq_avx(auVar50,8);
      auVar50 = vpshldq_avx512_vbmi2(auVar32,auVar50,0x3e);
      auVar32 = vpsrlq_avx(auVar31,2);
      auVar31 = vpslldq_avx(auVar58,8);
      auVar37 = vpshldq_avx512_vbmi2(auVar31,auVar37,0x3f);
      auVar58 = vpsrlq_avx(auVar58,1);
      auVar52 = vpternlogq_avx512vl(auVar58,auVar32,auVar52,0xfe);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar57,auVar51,0xf8);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar53,auVar50,0x1e);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar34,auVar57 ^ auVar51,0x96);
      auVar52 = vpternlogq_avx512vl(auVar52,auVar35,auVar33 ^ auVar36,0x96);
      puVar1 = prVar60->parity_tapes;
      local_f0 = (anon_union_8_2_94730226_for_buffer)
                 ((anon_union_8_2_94730226_for_buffer *)(prVar60->tape + 0xf))->w;
      auStack_190[0] = 0;
      uVar8 = ~(-1 << ((byte)(8 - ((byte)local_e8 & 7)) & 0x1f));
      uVar21 = 0x81;
      puVar20 = auStack_190;
      uVar23 = local_e8;
      do {
        uVar24 = uVar23;
        pbVar11 = puVar1 + (uVar24 >> 3) + 1;
        uVar22 = (ulong)(pbVar11[-1] & uVar8);
        uVar23 = uVar25;
        uVar28 = uVar7;
        do {
          uVar22 = (ulong)*pbVar11 | uVar22 << 8;
          pbVar11 = pbVar11 + 1;
          uVar28 = uVar28 + 8;
          uVar23 = uVar23 - 8;
        } while (7 < (uint)uVar23);
        if ((uint)uVar23 != 0) {
          sVar5 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
          uVar22 = (ulong)(((uint)(*pbVar11 >> (uVar28 & 0x1f)) << sVar5) >> sVar5) |
                   uVar22 << (uVar23 & 0x3f);
        }
        *puVar20 = uVar22;
        uVar21 = uVar21 - 0x40;
        puVar20 = puVar20 + -1;
        uVar23 = uVar24 + 0x40;
      } while (0x3f < uVar21);
      bVar14 = (byte)uVar24 & 7;
      bVar18 = 8 - bVar14;
      sVar5 = (bVar18 < 0x21) * (' ' - bVar18);
      auVar57._8_8_ = 0;
      auVar57._0_8_ =
           (ulong)((((uint)puVar1[uVar24 + 0x40 >> 3] << sVar5) >> sVar5) >> (bVar14 ^ 7)) << 0x3f;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = auStack_190[0];
      uStack_198 = 0;
      auStack_190[0] = 0;
      auStack_190[1] = 0;
      uVar21 = 0x81;
      puVar20 = auStack_190;
      uVar23 = local_e8;
      do {
        uVar24 = uVar23;
        pbVar11 = local_f0.w + (uVar24 >> 3) + 1;
        uVar22 = (ulong)(pbVar11[-1] & uVar8);
        uVar23 = uVar25;
        uVar28 = uVar7;
        do {
          uVar22 = (ulong)*pbVar11 | uVar22 << 8;
          pbVar11 = pbVar11 + 1;
          uVar28 = uVar28 + 8;
          uVar23 = uVar23 - 8;
        } while (7 < (uint)uVar23);
        if ((uint)uVar23 != 0) {
          sVar5 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
          uVar22 = (ulong)(((uint)(*pbVar11 >> (uVar28 & 0x1f)) << sVar5) >> sVar5) |
                   uVar22 << (uVar23 & 0x3f);
        }
        *puVar20 = uVar22;
        uVar21 = uVar21 - 0x40;
        puVar20 = puVar20 + -1;
        uVar23 = uVar24 + 0x40;
      } while (0x3f < uVar21);
      bVar18 = (byte)uVar24 & 7;
      bVar14 = 8 - bVar18;
      sVar5 = (bVar14 < 0x21) * (' ' - bVar14);
      local_1a0.w = (uint8_t *)
                    ((ulong)((((uint)local_f0.w[uVar24 + 0x40 >> 3] << sVar5) >> sVar5) >>
                            (bVar18 ^ 7)) << 0x3f);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_1a0;
      auVar53 = auVar37 ^ auVar57 ^ auVar53;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = auStack_190[0];
      auVar37 = auVar52 ^ auVar36 ^ auVar37;
      local_140.w64[0] = auVar53._0_8_;
      local_140.w64[1] = auVar53._8_8_;
      local_140.w64[2] = auVar37._0_8_;
      local_140.w64[3] = auVar37._8_8_;
      w128_to_bitstream((bitstream_t *)&local_f0,(word128 *)&local_140,3,0x81);
      local_1a0 = (anon_union_8_2_94730226_for_buffer)prVar60->aux_bits;
      uStack_198 = (ulong)prVar60->aux_pos;
      tapes = prVar60;
      w128_to_bitstream((bitstream_t *)&local_1a0,(word128 *)&local_140,3,0x81);
      prVar60->aux_pos = prVar60->aux_pos + 0x81;
      lVar30 = CONCAT44(uVar61,iVar26) + 1;
      plVar29 = local_160 + -1;
      local_c0._0_4_ = local_c0._0_4_ + -0x102;
      uVar7 = uVar7 + 2;
      uVar25 = uVar25 - 2;
    } while (lVar30 != 4);
  }
  return;
}

Assistant:

void lowmc_compute_aux(const lowmc_parameters_t* lowmc, lowmc_key_t* key, randomTape_t* tapes) {
  const uint32_t lowmc_id = lowmc_get_id(lowmc);
#if defined(WITH_OPT)
#if defined(WITH_AVX2)
  /* AVX2 enabled instances */
  if (CPU_SUPPORTS_AVX2) {
    switch (lowmc_id) {
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_aux_s256_lowmc_129_129_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_aux_s256_lowmc_192_192_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_aux_s256_lowmc_255_255_4(key, tapes);
      return;
#endif
    }
  }
#endif

#if defined(WITH_SSE2) || defined(WITH_NEON)
  /* SSE2/NEON enabled instances */
  if (CPU_SUPPORTS_SSE2 || CPU_SUPPORTS_NEON) {
    switch (lowmc_id) {
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_aux_s128_lowmc_129_129_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_aux_s128_lowmc_192_192_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_aux_s128_lowmc_255_255_4(key, tapes);
      return;
#endif
    }
  }
#endif
#endif

#if !defined(NO_UINT64_FALLBACK)
  /* uint64_t implementations */
  switch (lowmc_id) {
    /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
  case LOWMC_ID(129, 43):
    lowmc_aux_uint64_lowmc_129_129_4(key, tapes);
    return;
#endif
#if defined(WITH_LOWMC_192_192_4)
  case LOWMC_ID(192, 64):
    lowmc_aux_uint64_lowmc_192_192_4(key, tapes);
    return;
#endif
#if defined(WITH_LOWMC_255_255_4)
  case LOWMC_ID(255, 85):
    lowmc_aux_uint64_lowmc_255_255_4(key, tapes);
    return;
#endif
  }
#endif

  UNREACHABLE;
}